

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessInfo.cc
# Opt level: O0

string * muduo::ProcessInfo::username_abi_cxx11_(void)

{
  char *pcVar1;
  uid_t __uid;
  string *in_RDI;
  char *name;
  char buf [8192];
  passwd *result;
  passwd pwd;
  allocator local_2051;
  char *local_2050;
  char local_2048 [8200];
  passwd *local_40;
  passwd local_38;
  
  local_40 = (passwd *)0x0;
  local_2050 = "unknownuser";
  __uid = uid();
  getpwuid_r(__uid,&local_38,local_2048,0x2000,&local_40);
  if (local_40 != (passwd *)0x0) {
    local_2050 = local_38.pw_name;
  }
  pcVar1 = local_2050;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,pcVar1,&local_2051);
  std::allocator<char>::~allocator((allocator<char> *)&local_2051);
  return in_RDI;
}

Assistant:

string ProcessInfo::username()
{
  struct passwd pwd;
  struct passwd* result = NULL;
  char buf[8192];
  const char* name = "unknownuser";

  getpwuid_r(uid(), &pwd, buf, sizeof buf, &result);
  if (result)
  {
    name = pwd.pw_name;
  }
  return name;
}